

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

char * __thiscall FParser::GetTokens(FParser *this,char *s)

{
  byte bVar1;
  byte *tokn;
  char *pcVar2;
  bool bVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  
  this->Rover = s;
  this->NumTokens = 1;
  *this->Tokens[0] = '\0';
  this->TokenType[(long)this->NumTokens + -1] = name_;
  this->Section = (DFsSection *)0x0;
  NextToken(this);
  this->LineStart = this->Rover;
  if (*this->Rover == '\0') {
    iVar6 = this->NumTokens + -1;
  }
  else {
LAB_004f90bd:
    iVar6 = this->NumTokens;
    tokn = (byte *)this->Tokens[(long)iVar6 + -1];
    if (this->Section == (DFsSection *)0x0) {
      pbVar4 = (byte *)this->Rover;
      if (this->TokenType[(long)iVar6 + -1] == string_) {
switchD_004f9104_caseD_4:
        do {
          bVar5 = *pbVar4;
          if (bVar5 == 0x5c) {
            this->Rover = (char *)(pbVar4 + 1);
            bVar5 = pbVar4[1];
            if ((byte)(bVar5 - 0x30) < 10) {
              add_char((char *)tokn,'\x1c');
              bVar5 = *this->Rover + 0x11;
            }
            else if ((bVar5 != 0x22) && (bVar5 != 0x3f)) {
              if (bVar5 == 0x74) {
                bVar5 = 9;
              }
              else if (bVar5 == 0x61) {
                bVar5 = 7;
              }
              else if (bVar5 == 0x6e) {
                bVar5 = 10;
              }
            }
          }
          else if (bVar5 == 0x22) goto code_r0x004f91bc;
          add_char((char *)tokn,bVar5);
          pbVar4 = (byte *)(this->Rover + 1);
          this->Rover = (char *)pbVar4;
        } while( true );
      }
      bVar5 = *pbVar4;
      if (bVar5 != 0x3b) {
        switch(this->TokenType[(long)iVar6 + -1]) {
        case name_:
          while (bVar3 = isop((int)(char)bVar5), !bVar3) {
            pcVar2 = this->Rover;
            this->Rover = pcVar2 + 1;
            add_char((char *)tokn,*pcVar2);
            bVar5 = *this->Rover;
          }
          break;
        case number:
          while (bVar5 == 0x2e || (byte)(bVar5 - 0x30) < 10) {
            this->Rover = (char *)(pbVar4 + 1);
            add_char((char *)tokn,*pbVar4);
            pbVar4 = (byte *)this->Rover;
            bVar5 = *pbVar4;
          }
          break;
        case operator_:
          bVar1 = *tokn;
          if (bVar1 != 0) {
            if (((bVar1 & 0xfe) == 0x28) || (bVar5 != 0x3d && bVar5 != bVar1)) break;
          }
          add_char((char *)tokn,bVar5);
          pbVar4 = (byte *)this->Rover;
        default:
          goto switchD_004f9104_caseD_3;
        case unset:
          goto switchD_004f9104_caseD_4;
        }
        goto LAB_004f91c3;
      }
    }
    iVar6 = iVar6 + -1;
    if ((tokn != (byte *)0x0) && (*tokn != 0)) goto LAB_004f9246;
  }
  this->NumTokens = iVar6;
LAB_004f9246:
  pcVar2 = this->Rover;
  this->Rover = pcVar2 + 1;
  return pcVar2 + 1;
code_r0x004f91bc:
  this->Rover = (char *)(pbVar4 + 1);
LAB_004f91c3:
  NextToken(this);
  goto LAB_004f90bd;
switchD_004f9104_caseD_3:
  this->Rover = (char *)(pbVar4 + 1);
  goto LAB_004f90bd;
}

Assistant:

char *FParser::GetTokens(char *s)
{
	char *tokn = NULL;

	Rover = s;
	NumTokens = 1;
	Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
	
	Section = NULL;   // default to no section found
	
	NextToken();
	LineStart = Rover;      // save the start
	
	if(*Rover)
	{
		while(1)
		{
			tokn = Tokens[NumTokens-1];
			if(Section)
			{
				// a { or } section brace has been found
				break;        // stop parsing now
			}
			else if(TokenType[NumTokens-1] != string_)
			{
				if(*Rover == ';') break;     // check for end of command ';'
			}
			
			switch(TokenType[NumTokens-1])
			{
			case unset:
			case string_:
				while(*Rover != '\"')     // dedicated loop for speed
				{
					if(*Rover == '\\')       // escape sequences
					{
						Rover++;
						if (*Rover>='0' && *Rover<='9')
						{
							add_char(tokn, TEXTCOLOR_ESCAPE);
							add_char(tokn, *Rover+'A'-'0');
						}
						else add_char(tokn, escape_sequence(*Rover));
					}
					else
						add_char(tokn, *Rover);
					Rover++;
				}
				Rover++;
				NextToken();       // end of this token
				continue;
				
			case operator_:
				// all 2-character operators either end in '=' or
				// are 2 of the same character
				// do not allow 2-characters for brackets '(' ')'
				// which are still being considered as operators
				
				// operators are only 2-char max, do not need
				// a seperate loop
				
				if((*tokn && *Rover != '=' && *Rover!=*tokn) ||
					*tokn == '(' || *tokn == ')')
				{
					// end of operator
					NextToken();
					continue;
				}
				add_char(tokn, *Rover);
				break;
				
			case number:
				
				// haleyjd: 8-17
				// add while number chars are read
				
				while(isnum(*Rover))       // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			case name_:
				
				// add the chars
				
				while(!isop(*Rover))        // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			default:
				break;
			}
			Rover++;
		}
	}
		
	// check for empty last token
	
	if(!tokn || !tokn[0])
	{
		NumTokens = NumTokens - 1;
	}
	
	Rover++;
	return Rover;
}